

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O2

Duration __thiscall kj::Thread::getCpuTime(Thread *this)

{
  int iVar1;
  clockid_t clockId;
  timespec ts;
  Fault f_1;
  clockid_t local_24;
  timespec local_20;
  Fault local_10;
  
  iVar1 = pthread_getcpuclockid(this->threadId,&local_24);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/thread.c++"
               ,0x84,iVar1,"pthread_getcpuclockid","");
    kj::_::Debug::Fault::fatal((Fault *)&local_20);
  }
  do {
    iVar1 = clock_gettime(local_24,&local_20);
    if (-1 < iVar1) goto LAB_003a5af6;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&local_10,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/thread.c++"
               ,0x88,iVar1,"clock_gettime(clockId, &ts)","");
    kj::_::Debug::Fault::fatal(&local_10);
  }
LAB_003a5af6:
  return (Duration)(local_20.tv_sec * 1000000000 + local_20.tv_nsec);
}

Assistant:

kj::Duration Thread::getCpuTime() const {
  clockid_t clockId;
  int pthreadResult = pthread_getcpuclockid(
      *reinterpret_cast<const pthread_t*>(&threadId), &clockId);
  if (pthreadResult != 0) {
    KJ_FAIL_SYSCALL("pthread_getcpuclockid", pthreadResult);
  }

  struct timespec ts;
  KJ_SYSCALL(clock_gettime(clockId, &ts));

  return ts.tv_sec * kj::SECONDS + ts.tv_nsec * kj::NANOSECONDS;
}